

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O1

bool __thiscall
google::protobuf::ZeroCopyCodedInputStream::Skip(ZeroCopyCodedInputStream *this,int count)

{
  CodedInputStream *pCVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  if (count < 0) {
    return false;
  }
  pCVar1 = this->cis_;
  iVar2 = *(int *)&pCVar1->buffer_end_ - (int)pCVar1->buffer_;
  if (iVar2 < count) {
    if (pCVar1->buffer_size_after_limit_ < 1) {
      uVar3 = count - iVar2;
      pCVar1->buffer_ = (uint8 *)0x0;
      pCVar1->buffer_end_ = (uint8 *)0x0;
      iVar2 = pCVar1->current_limit_;
      if (pCVar1->total_bytes_limit_ < pCVar1->current_limit_) {
        iVar2 = pCVar1->total_bytes_limit_;
      }
      iVar4 = iVar2 - pCVar1->total_bytes_read_;
      if (iVar4 < (int)uVar3) {
        if (0 < iVar4) {
          pCVar1->total_bytes_read_ = iVar2;
          (*pCVar1->input_->_vptr_ZeroCopyInputStream[4])();
        }
      }
      else {
        iVar2 = (*pCVar1->input_->_vptr_ZeroCopyInputStream[4])(pCVar1->input_,(ulong)uVar3);
        if ((char)iVar2 != '\0') {
          pCVar1->total_bytes_read_ = pCVar1->total_bytes_read_ + uVar3;
          return true;
        }
        iVar2 = (*pCVar1->input_->_vptr_ZeroCopyInputStream[5])();
        pCVar1->total_bytes_read_ = iVar2;
      }
    }
    else {
      pCVar1->buffer_ = pCVar1->buffer_ + iVar2;
    }
    return false;
  }
  pCVar1->buffer_ = pCVar1->buffer_ + (uint)count;
  return true;
}

Assistant:

inline bool CodedInputStream::Skip(int count) {
  if (count < 0) return false;  // security: count is often user-supplied

  const int original_buffer_size = BufferSize();

  if (count <= original_buffer_size) {
    // Just skipping within the current buffer.  Easy.
    Advance(count);
    return true;
  }

  return SkipFallback(count, original_buffer_size);
}